

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

_Bool wildcard_iterate(char *filename,_func__Bool_void_ptr_char_ptr *func,void *ctx)

{
  bool bVar1;
  _Bool _Var2;
  size_t sVar3;
  char *pcVar4;
  SftpWildcardMatcher *swcm_00;
  char *pcVar5;
  _Bool matched;
  SftpWildcardMatcher *swcm;
  _Bool toret;
  _Bool is_wc;
  char *cname;
  char *newname;
  char *unwcfname;
  void *ctx_local;
  _func__Bool_void_ptr_char_ptr *func_local;
  char *filename_local;
  
  sVar3 = strlen(filename);
  pcVar4 = (char *)safemalloc(sVar3 + 1,1,0);
  _Var2 = wc_unescape(pcVar4,filename);
  if (((_Var2 ^ 0xffU) & 1) == 0) {
    pcVar5 = canonify(pcVar4);
    swcm._6_1_ = (*func)(ctx,pcVar5);
    safefree(pcVar5);
    safefree(pcVar4);
  }
  else {
    swcm_00 = sftp_begin_wildcard_matching(filename);
    bVar1 = false;
    safefree(pcVar4);
    if (swcm_00 == (SftpWildcardMatcher *)0x0) {
      return false;
    }
    swcm._6_1_ = true;
    while (pcVar4 = sftp_wildcard_get_filename(swcm_00), pcVar4 != (char *)0x0) {
      pcVar5 = canonify(pcVar4);
      safefree(pcVar4);
      bVar1 = true;
      _Var2 = (*func)(ctx,pcVar5);
      if (!_Var2) {
        swcm._6_1_ = false;
      }
      safefree(pcVar5);
    }
    if (!bVar1) {
      printf("%s: nothing matched\n",filename);
    }
    sftp_finish_wildcard_matching(swcm_00);
  }
  return swcm._6_1_;
}

Assistant:

bool wildcard_iterate(char *filename, bool (*func)(void *, char *), void *ctx)
{
    char *unwcfname, *newname, *cname;
    bool is_wc, toret;

    unwcfname = snewn(strlen(filename)+1, char);
    is_wc = !wc_unescape(unwcfname, filename);

    if (is_wc) {
        SftpWildcardMatcher *swcm = sftp_begin_wildcard_matching(filename);
        bool matched = false;
        sfree(unwcfname);

        if (!swcm)
            return false;

        toret = true;

        while ( (newname = sftp_wildcard_get_filename(swcm)) != NULL ) {
            cname = canonify(newname);
            sfree(newname);
            matched = true;
            if (!func(ctx, cname))
                toret = false;
            sfree(cname);
        }

        if (!matched) {
            /* Politely warn the user that nothing matched. */
            printf("%s: nothing matched\n", filename);
        }

        sftp_finish_wildcard_matching(swcm);
    } else {
        cname = canonify(unwcfname);
        toret = func(ctx, cname);
        sfree(cname);
        sfree(unwcfname);
    }

    return toret;
}